

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_short>,ImPlot::TransformerLogLog>
               (GetterXsYs<unsigned_short> *getter,TransformerLogLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  ushort uVar6;
  ImPlotPlot *pIVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ImPlotContext *gp;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar11 = GImPlot;
  pIVar7 = GImPlot->CurrentPlot;
  if (((pIVar7->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar14 = getter->Count;
    local_48 = iVar14 + -1;
    lVar13 = (long)((getter->Offset % iVar14 + iVar14) % iVar14) * (long)getter->Stride;
    uVar6 = *(ushort *)((long)getter->Ys + lVar13);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar8 = log10((double)*(ushort *)((long)getter->Xs + lVar13) / (pIVar7->XAxis).Range.Min);
    pIVar7 = pIVar11->CurrentPlot;
    dVar2 = pIVar11->LogDenX;
    dVar3 = (pIVar7->XAxis).Range.Min;
    dVar4 = (pIVar7->XAxis).Range.Max;
    dVar9 = log10((double)uVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar14 = transformer->YAxis;
    pIVar7 = pIVar11->CurrentPlot;
    auVar20._8_8_ = dVar9;
    auVar20._0_8_ = dVar8;
    auVar23._8_8_ = pIVar11->LogDenY[iVar14];
    auVar23._0_8_ = dVar2;
    auVar18 = divpd(auVar20,auVar23);
    dVar2 = pIVar7->YAxis[iVar14].Range.Min;
    IVar5 = pIVar11->PixelRange[iVar14].Min;
    local_3c.y = (float)(pIVar11->My[iVar14] *
                         (((double)(float)auVar18._8_8_ * (pIVar7->YAxis[iVar14].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
    local_3c.x = (float)(pIVar11->Mx *
                         (((double)(float)auVar18._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_short>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLogLog> *)
               local_58,DrawList,&pIVar7->PlotRect);
  }
  else {
    iVar14 = getter->Count;
    lVar13 = (long)((getter->Offset % iVar14 + iVar14) % iVar14) * (long)getter->Stride;
    uVar6 = *(ushort *)((long)getter->Ys + lVar13);
    dVar8 = log10((double)*(ushort *)((long)getter->Xs + lVar13) / (pIVar7->XAxis).Range.Min);
    pIVar7 = pIVar11->CurrentPlot;
    dVar2 = pIVar11->LogDenX;
    dVar3 = (pIVar7->XAxis).Range.Min;
    dVar4 = (pIVar7->XAxis).Range.Max;
    dVar9 = log10((double)uVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar14 = transformer->YAxis;
    pIVar7 = pIVar11->CurrentPlot;
    auVar21._8_8_ = pIVar11->LogDenY[iVar14];
    auVar21._0_8_ = dVar2;
    auVar18._8_8_ = dVar9;
    auVar18._0_8_ = dVar8;
    auVar18 = divpd(auVar18,auVar21);
    dVar2 = pIVar7->YAxis[iVar14].Range.Min;
    IVar5 = pIVar11->PixelRange[iVar14].Min;
    local_58._4_4_ =
         (float)(pIVar11->My[iVar14] *
                 (((double)(float)auVar18._8_8_ * (pIVar7->YAxis[iVar14].Range.Max - dVar2) + dVar2)
                 - dVar2) + (double)IVar5.y);
    local_58._0_4_ =
         (float)(pIVar11->Mx *
                 (((double)(float)auVar18._0_8_ * (dVar4 - dVar3) + dVar3) -
                 (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
    iVar14 = getter->Count;
    if (1 < iVar14) {
      iVar15 = 1;
      do {
        pIVar12 = GImPlot;
        lVar13 = (long)(((getter->Offset + iVar15) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        uVar6 = *(ushort *)((long)getter->Ys + lVar13);
        dVar8 = log10((double)*(ushort *)((long)getter->Xs + lVar13) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar7 = pIVar12->CurrentPlot;
        dVar2 = pIVar12->LogDenX;
        dVar3 = (pIVar7->XAxis).Range.Min;
        dVar4 = (pIVar7->XAxis).Range.Max;
        dVar9 = log10((double)uVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
        iVar14 = transformer->YAxis;
        pIVar7 = pIVar12->CurrentPlot;
        auVar19._8_8_ = dVar9;
        auVar19._0_8_ = dVar8;
        auVar22._8_8_ = pIVar12->LogDenY[iVar14];
        auVar22._0_8_ = dVar2;
        auVar18 = divpd(auVar19,auVar22);
        dVar2 = pIVar7->YAxis[iVar14].Range.Min;
        IVar5 = pIVar12->PixelRange[iVar14].Min;
        fVar16 = (float)(pIVar12->Mx *
                         (((double)(float)auVar18._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
        fVar17 = (float)(pIVar12->My[iVar14] *
                         (((double)(float)auVar18._8_8_ * (pIVar7->YAxis[iVar14].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
        local_60.y = fVar17;
        local_60.x = fVar16;
        pIVar7 = pIVar11->CurrentPlot;
        fVar10 = (float)local_58._4_4_;
        if (fVar17 <= (float)local_58._4_4_) {
          fVar10 = fVar17;
        }
        if ((fVar10 < (pIVar7->PlotRect).Max.y) &&
           (fVar10 = (float)(~-(uint)(fVar17 <= (float)local_58._4_4_) & (uint)fVar17 |
                            local_58._4_4_ & -(uint)(fVar17 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar10 && fVar10 != *pfVar1)) {
          fVar10 = (float)local_58._0_4_;
          if (fVar16 <= (float)local_58._0_4_) {
            fVar10 = fVar16;
          }
          if ((fVar10 < (pIVar7->PlotRect).Max.x) &&
             (fVar10 = (float)(-(uint)(fVar16 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar16 <= (float)local_58._0_4_) & (uint)fVar16),
             (pIVar7->PlotRect).Min.x <= fVar10 && fVar10 != (pIVar7->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar15 = iVar15 + 1;
        iVar14 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar15 < iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}